

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::predict_or_learn<true>(csoaa *c,single_learner *base,example *ec)

{
  float fVar1;
  features *pfVar2;
  float *pfVar3;
  uint64_t i;
  uint i_00;
  wclass *cl;
  wclass *pwVar4;
  long lVar5;
  unsigned_long uVar6;
  float fVar7;
  float score;
  uint32_t prediction;
  wclass *local_60;
  wclass *local_58;
  float temp;
  wclass *local_48;
  size_t sStack_40;
  
  pwVar4 = (ec->l).cs.costs._begin;
  local_60 = (ec->l).cs.costs._end;
  local_48 = (ec->l).cs.costs.end_array;
  sStack_40 = (ec->l).cs.costs.erase_count;
  prediction = 1;
  score = 3.4028235e+38;
  pfVar2 = ec->passthrough;
  if (pfVar2 == (features *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = (long)(pfVar2->values)._end - (long)(pfVar2->values)._begin >> 2;
  }
  (ec->l).cs.costs._begin = (wclass *)0x0;
  (ec->l).simple.initial = 0.0;
  local_58 = pwVar4;
  if (local_60 == pwVar4) {
    for (i_00 = 1; i_00 <= c->num_classes; i_00 = i_00 + 1) {
      inner_loop<false>(base,ec,i_00,3.4028235e+38,&prediction,&score,&temp);
    }
  }
  else {
    for (; pwVar4 != local_60; pwVar4 = pwVar4 + 1) {
      inner_loop<true>(base,ec,pwVar4->class_index,pwVar4->x,&prediction,&score,
                       &pwVar4->partial_prediction);
    }
    ec->partial_prediction = score;
  }
  pwVar4 = local_58;
  pfVar2 = ec->passthrough;
  if (pfVar2 != (features *)0x0) {
    pfVar3 = (pfVar2->values)._begin;
    fVar7 = 3.4028235e+38;
    uVar6 = 0;
    for (; (long)(pfVar2->values)._end - (long)pfVar3 >> 2 != lVar5; lVar5 = lVar5 + 1) {
      fVar1 = pfVar3[lVar5];
      if ((ec->partial_prediction < fVar1) && (fVar1 < fVar7)) {
        uVar6 = (pfVar2->indicies)._begin[lVar5];
        fVar7 = fVar1;
      }
    }
    i = 0x2155014;
    if (fVar7 < 3.4028235e+38) {
      add_passthrough_feature_magic(ec,0x398d4541,0x1638ab8,fVar7 - ec->partial_prediction);
      i = uVar6 + 0x1638ab9;
    }
    add_passthrough_feature_magic(ec,0x398d4541,i,1.0);
  }
  (ec->pred).multiclass = prediction;
  (ec->l).cs.costs._begin = pwVar4;
  (ec->l).cs.costs._end = local_60;
  (ec->l).cs.costs.end_array = local_48;
  (ec->l).cs.costs.erase_count = sStack_40;
  return;
}

Assistant:

void predict_or_learn(csoaa& c, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;
  uint32_t prediction = 1;
  float score = FLT_MAX;
  size_t pt_start = ec.passthrough ? ec.passthrough->size() : 0;
  ec.l.simple = {0., 0., 0.};
  if (ld.costs.size() > 0)
  {
    for (auto& cl : ld.costs)
      inner_loop<is_learn>(base, ec, cl.class_index, cl.x, prediction, score, cl.partial_prediction);
    ec.partial_prediction = score;
  }
  else if (DO_MULTIPREDICT && !is_learn)
  {
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    base.multipredict(ec, 0, c.num_classes, c.pred, false);
    for (uint32_t i = 1; i <= c.num_classes; i++)
    {
      add_passthrough_feature(ec, i, c.pred[i - 1].scalar);
      if (c.pred[i - 1].scalar < c.pred[prediction - 1].scalar)
        prediction = i;
    }
    ec.partial_prediction = c.pred[prediction - 1].scalar;
  }
  else
  {
    float temp;
    for (uint32_t i = 1; i <= c.num_classes; i++) inner_loop<false>(base, ec, i, FLT_MAX, prediction, score, temp);
  }
  if (ec.passthrough)
  {
    uint64_t second_best = 0;
    float second_best_cost = FLT_MAX;
    for (size_t i = 0; i < ec.passthrough->size() - pt_start; i++)
    {
      float val = ec.passthrough->values[pt_start + i];
      if ((val > ec.partial_prediction) && (val < second_best_cost))
      {
        second_best_cost = val;
        second_best = ec.passthrough->indicies[pt_start + i];
      }
    }
    if (second_best_cost < FLT_MAX)
    {
      float margin = second_best_cost - ec.partial_prediction;
      add_passthrough_feature(ec, constant * 2, margin);
      add_passthrough_feature(ec, constant * 2 + 1 + second_best, 1.);
    }
    else
      add_passthrough_feature(ec, constant * 3, 1.);
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}